

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

void __thiscall
embree::SceneGraphFlattener::convertFlattenedInstances
          (SceneGraphFlattener *this,
          vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
          *group,Ref<embree::SceneGraph::Node> *node)

{
  Node *pNVar1;
  Ref<embree::SceneGraph::Node> *pRVar2;
  long *plVar3;
  Ref<embree::SceneGraph::Node> *child;
  Ref<embree::SceneGraph::Node> *node_00;
  
  pNVar1 = node->ptr;
  if (pNVar1 != (Node *)0x0) {
    plVar3 = (long *)__dynamic_cast(pNVar1,&SceneGraph::Node::typeinfo,
                                    &SceneGraph::TransformNode::typeinfo,0);
    if (plVar3 == (long *)0x0) {
      plVar3 = (long *)__dynamic_cast(pNVar1,&SceneGraph::Node::typeinfo,
                                      &SceneGraph::GroupNode::typeinfo,0);
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 0x10))(plVar3);
        pRVar2 = (Ref<embree::SceneGraph::Node> *)plVar3[0xe];
        for (node_00 = (Ref<embree::SceneGraph::Node> *)plVar3[0xd]; node_00 != pRVar2;
            node_00 = node_00 + 1) {
          convertFlattenedInstances(this,group,node_00);
        }
        (**(code **)(*plVar3 + 0x18))(plVar3);
      }
    }
    else {
      (**(code **)(*plVar3 + 0x10))(plVar3);
      std::
      vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
      ::push_back(group,node);
      (**(code **)(*plVar3 + 0x18))(plVar3);
    }
  }
  return;
}

Assistant:

void SceneGraph::PointSetNode::print(std::ostream& cout, int depth) {
    cout << "PointSetNode @ " << this << " { closed = " << closed << " }" << std::endl;
  }